

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

TreeEnsembleParameters_TreeNode_EvaluationInfo *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>
          (Arena *arena)

{
  TreeEnsembleParameters_TreeNode_EvaluationInfo *pTVar1;
  
  if (arena != (Arena *)0x0) {
    pTVar1 = DoCreateMessage<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>
                       (arena);
    return pTVar1;
  }
  pTVar1 = (TreeEnsembleParameters_TreeNode_EvaluationInfo *)operator_new(0x28);
  CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo::
  TreeEnsembleParameters_TreeNode_EvaluationInfo(pTVar1,(Arena *)0x0,false);
  return pTVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }